

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O0

void I_PrintStr(char *cp)

{
  size_t sVar1;
  char *__s;
  char *local_28;
  char *dstp;
  char *srcp;
  char *copy;
  char *cp_local;
  
  sVar1 = strlen(cp);
  __s = (char *)operator_new__(sVar1 + 1);
  local_28 = __s;
  dstp = cp;
  while (*dstp != '\0') {
    if ((((*dstp == '\x1c') || (*dstp == '\x1d')) || (*dstp == '\x1e')) || (*dstp == '\x1f')) {
      if (dstp[1] == '\0') break;
      dstp = dstp + 2;
    }
    else {
      *local_28 = *dstp;
      local_28 = local_28 + 1;
      dstp = dstp + 1;
    }
  }
  *local_28 = '\0';
  fputs(__s,_stdout);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  fflush(_stdout);
  return;
}

Assistant:

void I_PrintStr (const char *cp)
{
	// Strip out any color escape sequences before writing to the log file
	char * copy = new char[strlen(cp)+1];
	const char * srcp = cp;
	char * dstp = copy;

	while (*srcp != 0)
	{
		if (*srcp!=0x1c && *srcp!=0x1d && *srcp!=0x1e && *srcp!=0x1f)
		{
			*dstp++=*srcp++;
		}
		else
		{
			if (srcp[1]!=0) srcp+=2;
			else break;
		}
	}
	*dstp=0;

	fputs (copy, stdout);
	delete [] copy;
	fflush (stdout);
}